

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader.cpp
# Opt level: O3

void __thiscall
COLLADASaxFWL::LibraryControllersLoader::LibraryControllersLoader
          (LibraryControllersLoader *this,IFilePartLoader *callingFilePartLoader)

{
  _Rb_tree_header *p_Var1;
  
  SourceArrayLoader::SourceArrayLoader(&this->super_SourceArrayLoader,callingFilePartLoader);
  (this->super_SourceArrayLoader).super_FilePartLoader.super_IFilePartLoader.super_ExtraDataLoader.
  _vptr_ExtraDataLoader = (_func_int **)&PTR__LibraryControllersLoader_009ab3f0;
  this->mCurrentControllerType = UNKNOWN_CONTROLLER;
  (this->mOriginalId)._M_dataplus._M_p = (pointer)&(this->mOriginalId).field_2;
  (this->mOriginalId)._M_string_length = 0;
  (this->mOriginalId).field_2._M_local_buf[0] = '\0';
  (this->mCurrentControllerId)._M_dataplus._M_p = (pointer)&(this->mCurrentControllerId).field_2;
  (this->mCurrentControllerId)._M_string_length = 0;
  (this->mCurrentControllerId).field_2._M_local_buf[0] = '\0';
  (this->mCurrentControllerSourceUniqueId).mClassId = NO_TYPE;
  (this->mCurrentControllerSourceUniqueId).mObjectId = 0;
  (this->mCurrentControllerSourceUniqueId).mFileId = 0;
  (this->mCurrentControllerName)._M_dataplus._M_p = (pointer)&(this->mCurrentControllerName).field_2
  ;
  (this->mCurrentControllerName)._M_string_length = 0;
  (this->mCurrentControllerName).field_2._M_local_buf[0] = '\0';
  this->mJointSidsOrIds = (StringList *)0x0;
  p_Var1 = &(this->mJointSidsMap)._M_t._M_impl.super__Rb_tree_header;
  (this->mJointSidsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mJointSidsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->mCurrentSkinControllerData = (SkinControllerData *)0x0;
  this->mCurrentMorphController = (MorphController *)0x0;
  this->mCurrentInputParent = INPUT_PARENT_UNKNOWN;
  (this->mJointSidsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mJointSidsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mJointSidsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mJointIdsMap)._M_t._M_impl.super__Rb_tree_header;
  (this->mJointIdsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mJointIdsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mJointIdsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mJointIdsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this->mCurrentMaxOffset = 0;
  this->mCurrentOffset = 0;
  this->mJointOffset = 0;
  this->mWeightsOffset = 0;
  (this->mJointIdsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mCurrentJointsVertexPairCount = 0;
  memcpy(&this->mCurrentBindShapeMatrix,COLLADABU::Math::Matrix4::IDENTITY,0x88);
  this->mCurrentMatrixIndex = 0;
  this->mVerboseValidate = true;
  return;
}

Assistant:

LibraryControllersLoader::LibraryControllersLoader( IFilePartLoader* callingFilePartLoader )
		: SourceArrayLoader(callingFilePartLoader)
		, mCurrentControllerType( UNKNOWN_CONTROLLER )
		, mCurrentSkinControllerData(0)
		, mCurrentMorphController(0)
		, mCurrentInputParent( INPUT_PARENT_UNKNOWN )
		, mJointSidsOrIds( 0 )
		, mCurrentJointsVertexPairCount( 0 )
		, mJointOffset(0)
		, mWeightsOffset(0)
		, mCurrentMaxOffset(0)
		, mCurrentOffset(0)
		, mCurrentBindShapeMatrix( COLLADABU::Math::Matrix4::IDENTITY)
		, mCurrentMatrixIndex(0)
		, mVerboseValidate(true)
	{}